

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O1

QList<std::pair<double,_double>_> * __thiscall
QGraphicsItemAnimation::rotationList
          (QList<std::pair<double,_double>_> *__return_storage_ptr__,QGraphicsItemAnimation *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<double,_double> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar1 = (uint)*(undefined8 *)(*(long *)(this + 0x10) + 200);
  QList<std::pair<double,_double>_>::reserve(__return_storage_ptr__,(long)(int)uVar1);
  if (0 < (int)uVar1) {
    uVar2 = (ulong)(uVar1 & 0x7fffffff);
    lVar3 = 8;
    do {
      QtPrivate::QPodArrayOps<std::pair<double,double>>::emplace<double_const&,double_const&>
                ((QPodArrayOps<std::pair<double,double>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,
                 (double *)(*(long *)(*(long *)(this + 0x10) + 0xc0) + lVar3 + -8),
                 (double *)(*(long *)(*(long *)(this + 0x10) + 0xc0) + lVar3));
      QList<std::pair<double,_double>_>::end(__return_storage_ptr__);
      lVar3 = lVar3 + 0x10;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<std::pair<qreal, qreal> > QGraphicsItemAnimation::rotationList() const
{
    QList<std::pair<qreal, qreal>> list;
    const int numRotations = d->rotation.size();
    list.reserve(numRotations);
    for (int i = 0; i < numRotations; ++i)
        list.emplace_back(d->rotation.at(i).step, d->rotation.at(i).value);

    return list;
}